

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_gui.cpp
# Opt level: O2

bool I_SetCursor(FTexture *cursorpic)

{
  bool bVar1;
  BYTE buffer [4096];
  FBitmap local_1048;
  BYTE local_1018 [4096];
  
  SDL_ShowCursor(0);
  bVar1 = true;
  if ((cursorpic != (FTexture *)0x0) && (cursorpic->UseType != '\r')) {
    if ((cursorpic->Width < 0x21) && (cursorpic->Height < 0x21)) {
      SDL_LockSurface(0);
      memset(local_1018,0,0x1000);
      local_1048._vptr_FBitmap = (_func_int **)&PTR__FBitmap_00703f00;
      local_1048.Pitch = 0x80;
      local_1048.Width = 0x20;
      local_1048.Height = 0x20;
      local_1048.FreeBuffer = false;
      local_1048.ClipRect.x = 0;
      local_1048.ClipRect.y = 0;
      local_1048.ClipRect.width = 0x20;
      local_1048.ClipRect.height = 0x20;
      local_1048.data = local_1018;
      (*cursorpic->_vptr_FTexture[4])(cursorpic,&local_1048,0,0,0,0);
      memcpy(_DAT_00000020,local_1048.data,0x1000);
      SDL_UnlockSurface(0);
      FBitmap::~FBitmap(&local_1048);
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool I_SetCursor(FTexture *cursorpic)
{
	SDL_ShowCursor(SDL_DISABLE);
	static SDL_Cursor *cursor;
	static SDL_Surface *cursorSurface;

	if (cursorpic != NULL && cursorpic->UseType != FTexture::TEX_Null)
	{
		// Must be no larger than 32x32.
		if (cursorpic->GetWidth() > 32 || cursorpic->GetHeight() > 32)
		{
			return false;
		}

		if (cursorSurface == NULL)
//			cursorSurface = SDL_CreateRGBSurface (0, 32, 32, 32, MAKEARGB(0,255,0,0), MAKEARGB(0,0,255,0), MAKEARGB(0,0,0,255), MAKEARGB(255,0,0,0));

		SDL_LockSurface(cursorSurface);
		BYTE buffer[32*32*4];
		memset(buffer, 0, 32*32*4);
		FBitmap bmp(buffer, 32*4, 32, 32);
		cursorpic->CopyTrueColorPixels(&bmp, 0, 0);
		memcpy(cursorSurface->pixels, bmp.GetPixels(), 32*32*4);
		SDL_UnlockSurface(cursorSurface);

//		if (cursor)
//			SDL_FreeCursor (cursor);
//		cursor = SDL_CreateColorCursor (cursorSurface, 0, 0);
//		SDL_SetCursor (cursor);
//		SDL_ShowCursor(SDL_ENABLE);
	}
	else
	{
		if (cursor)
		{
			SDL_SetCursor (NULL);
			SDL_FreeCursor (cursor);
			cursor = NULL;
		}
		if (cursorSurface != NULL)
		{
			SDL_FreeSurface(cursorSurface);
			cursorSurface = NULL;
		}
	}
	return true;
}